

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaK_concat(FuncState *fs,int *l1,int l2)

{
  int iVar1;
  int in_EDX;
  FuncState *in_RSI;
  FuncState *in_RDI;
  int next;
  int list;
  int pc;
  
  if (in_EDX != -1) {
    if (*(int *)&in_RSI->f == -1) {
      *(int *)&in_RSI->f = in_EDX;
    }
    else {
      iVar1 = *(int *)&in_RSI->f;
      do {
        pc = iVar1;
        iVar1 = getjump(in_RDI,pc);
      } while (iVar1 != -1);
      fixjump(in_RSI,in_EDX,pc);
    }
  }
  return;
}

Assistant:

static void luaK_concat(FuncState*fs,int*l1,int l2){
if(l2==(-1))return;
else if(*l1==(-1))
*l1=l2;
else{
int list=*l1;
int next;
while((next=getjump(fs,list))!=(-1))
list=next;
fixjump(fs,list,l2);
}
}